

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O0

PointerReader * __thiscall
capnp::anon_unknown_0::MembraneCapTableReader::imbue
          (PointerReader *__return_storage_ptr__,MembraneCapTableReader *this,PointerReader reader)

{
  bool bVar1;
  CapTableReader *pCVar2;
  Fault local_50;
  Fault f;
  CapTableReader **local_40;
  undefined1 local_38 [8];
  DebugComparison<capnp::_::CapTableReader_*&,_std::nullptr_t> _kjCondition;
  MembraneCapTableReader *this_local;
  
  _kjCondition._32_8_ = this;
  local_40 = (CapTableReader **)
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&this->inner);
  f.exception = (Exception *)0x0;
  kj::_::DebugExpression<capnp::_::CapTableReader*&>::operator==
            ((DebugComparison<capnp::_::CapTableReader_*&,_std::nullptr_t> *)local_38,
             (DebugExpression<capnp::_::CapTableReader*&> *)&local_40,&f.exception);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_38);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::CapTableReader*&,decltype(nullptr)>&,char_const(&)[24]>
              (&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/membrane.c++"
               ,0x2d,FAILED,"inner == nullptr","_kjCondition,\"can only call this once\"",
               (DebugComparison<capnp::_::CapTableReader_*&,_std::nullptr_t> *)local_38,
               (char (*) [24])"can only call this once");
    kj::_::Debug::Fault::fatal(&local_50);
  }
  pCVar2 = capnp::_::PointerReader::getCapTable(&reader);
  this->inner = pCVar2;
  capnp::_::PointerReader::imbue(__return_storage_ptr__,&reader,&this->super_CapTableReader);
  return __return_storage_ptr__;
}

Assistant:

_::PointerReader imbue(_::PointerReader reader) {
    KJ_REQUIRE(inner == nullptr, "can only call this once");
    inner = reader.getCapTable();
    return reader.imbue(this);
  }